

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O2

VkResult volkInitialize(void)

{
  void *context;
  char *load;
  
  context = (void *)dlopen("libvulkan.so.1",2);
  if ((context == (void *)0x0) &&
     (context = (void *)dlopen("libvulkan.so",2), context == (void *)0x0)) {
    return VK_ERROR_INITIALIZATION_FAILED;
  }
  load = "vkGetInstanceProcAddr";
  vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)dlsym();
  volkGenLoadLoader(context,(_func_PFN_vkVoidFunction_void_ptr_char_ptr *)load);
  return VK_SUCCESS;
}

Assistant:

VkResult volkInitialize(void)
{
#if defined(_WIN32)
	HMODULE module = LoadLibraryA("vulkan-1.dll");
	if (!module)
		return VK_ERROR_INITIALIZATION_FAILED;

	// note: function pointer is cast through void function pointer to silence cast-function-type warning on gcc8
	vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)(void(*)(void))GetProcAddress(module, "vkGetInstanceProcAddr");
#elif defined(__APPLE__)
	void* module = dlopen("libvulkan.dylib", RTLD_NOW | RTLD_LOCAL);
	if (!module)
		module = dlopen("libvulkan.1.dylib", RTLD_NOW | RTLD_LOCAL);
	if (!module)
		module = dlopen("libMoltenVK.dylib", RTLD_NOW | RTLD_LOCAL);
	if (!module)
		return VK_ERROR_INITIALIZATION_FAILED;

	vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)dlsym(module, "vkGetInstanceProcAddr");
#else
	void* module = dlopen("libvulkan.so.1", RTLD_NOW | RTLD_LOCAL);
	if (!module)
		module = dlopen("libvulkan.so", RTLD_NOW | RTLD_LOCAL);
	if (!module)
		return VK_ERROR_INITIALIZATION_FAILED;

	vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)dlsym(module, "vkGetInstanceProcAddr");
#endif

	volkGenLoadLoader(NULL, vkGetInstanceProcAddrStub);

	return VK_SUCCESS;
}